

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O0

REF_STATUS
ref_iso_segment_segment
          (REF_DBL *candidate0,REF_DBL *candidate1,REF_DBL *segment0,REF_DBL *segment1,REF_DBL *tt)

{
  REF_DBL RVar1;
  REF_DBL RVar2;
  REF_DBL RVar3;
  REF_DBL RVar4;
  double dVar5;
  double local_90;
  double local_80;
  double local_78;
  double local_68;
  double total_area;
  double seg1_area;
  double seg0_area;
  double cand1_area;
  double cand0_area;
  REF_DBL *tt_local;
  REF_DBL *segment1_local;
  REF_DBL *segment0_local;
  REF_DBL *candidate1_local;
  REF_DBL *candidate0_local;
  
  *tt = 0.0;
  tt[1] = 0.0;
  RVar1 = ref_iso_area(candidate0,segment1,segment0);
  RVar2 = ref_iso_area(candidate1,segment0,segment1);
  RVar3 = ref_iso_area(segment0,candidate1,candidate0);
  RVar4 = ref_iso_area(segment1,candidate0,candidate1);
  dVar5 = RVar3 + RVar4;
  if (dVar5 * 1e+20 <= 0.0) {
    local_68 = -(dVar5 * 1e+20);
  }
  else {
    local_68 = dVar5 * 1e+20;
  }
  local_78 = RVar3;
  if (RVar3 <= 0.0) {
    local_78 = -RVar3;
  }
  if (local_68 <= local_78) {
    candidate0_local._4_4_ = 4;
  }
  else {
    *tt = RVar3 / dVar5;
    dVar5 = RVar1 + RVar2;
    if (dVar5 * 1e+20 <= 0.0) {
      local_80 = -(dVar5 * 1e+20);
    }
    else {
      local_80 = dVar5 * 1e+20;
    }
    local_90 = RVar1;
    if (RVar1 <= 0.0) {
      local_90 = -RVar1;
    }
    if (local_80 <= local_90) {
      candidate0_local._4_4_ = 4;
    }
    else {
      tt[1] = RVar1 / dVar5;
      candidate0_local._4_4_ = 0;
    }
  }
  return candidate0_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_iso_segment_segment(REF_DBL *candidate0,
                                           REF_DBL *candidate1,
                                           REF_DBL *segment0, REF_DBL *segment1,
                                           REF_DBL *tt) {
  double cand0_area, cand1_area;
  double seg0_area, seg1_area;
  double total_area;

  tt[0] = 0.0;
  tt[1] = 0.0;

  /*         c1 tt[1]
   *        /
   *  s0---+----s1 tt[0]
   *      /
   *    c0
   */

  cand0_area = ref_iso_area(candidate0, segment1, segment0);
  cand1_area = ref_iso_area(candidate1, segment0, segment1);
  seg0_area = ref_iso_area(segment0, candidate1, candidate0);
  seg1_area = ref_iso_area(segment1, candidate0, candidate1);

  total_area = seg0_area + seg1_area;
  if (ref_math_divisible(seg0_area, total_area)) {
    tt[0] = seg0_area / total_area;
  } else {
    return REF_DIV_ZERO;
  }

  total_area = cand0_area + cand1_area;
  if (ref_math_divisible(cand0_area, total_area)) {
    tt[1] = cand0_area / total_area;
  } else {
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}